

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMig.h
# Opt level: O2

Mig_Obj_t * Mig_ManAppendObj(Mig_Man_t *p)

{
  int iVar1;
  undefined8 *puVar2;
  Mig_Obj_t *p_00;
  int v;
  
  v = p->nObjs;
  if (v == 0x7fffffff) {
    __assert_fail("p->nObjs < MIG_NONE",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmMig.h"
                  ,0xdc,"Mig_Obj_t *Mig_ManAppendObj(Mig_Man_t *)");
  }
  iVar1 = (p->vPages).nSize * 0x1000;
  if (iVar1 <= v) {
    if (v != iVar1) {
      __assert_fail("p->nObjs == (Vec_PtrSize(&p->vPages) << MIG_BASE)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmMig.h"
                    ,0xe0,"Mig_Obj_t *Mig_ManAppendObj(Mig_Man_t *)");
    }
    puVar2 = (undefined8 *)malloc(0x10020);
    memset(puVar2 + 1,0xff,0x10018);
    *puVar2 = p;
    Vec_PtrPush(&p->vPages,puVar2 + 2);
    v = p->nObjs;
  }
  p->nObjs = v + 1;
  p_00 = Mig_ManObj(p,v);
  if (0xfffffffd < (uint)p_00->pFans[3]) {
    Mig_FanSetId(p_00,3,p->nObjs + -1);
    return p_00;
  }
  __assert_fail("Mig_ObjIsNone(pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmMig.h"
                ,0xea,"Mig_Obj_t *Mig_ManAppendObj(Mig_Man_t *)");
}

Assistant:

static inline Mig_Obj_t * Mig_ManAppendObj( Mig_Man_t * p )
{
    Mig_Obj_t * pObj;
    assert( p->nObjs < MIG_NONE );
    if ( p->nObjs >= (Vec_PtrSize(&p->vPages) << MIG_BASE) )
    {
        Mig_Obj_t * pPage;// int i;
        assert( p->nObjs == (Vec_PtrSize(&p->vPages) << MIG_BASE) );
        pPage = ABC_FALLOC( Mig_Obj_t, MIG_MASK + 3 ); // 1 for mask, 1 for prefix, 1 for sentinel
        *((void **)pPage) = p;
//        *((void ***)(pPage + 1) - 1) = Vec_PtrArray(&p->vPages);
        Vec_PtrPush( &p->vPages, pPage + 1 );
//        if ( *((void ***)(pPage + 1) - 1) != Vec_PtrArray(&p->vPages) )
//            Vec_PtrForEachEntry( Mig_Obj_t *, &p->vPages, pPage, i )
//                *((void ***)pPage - 1) = Vec_PtrArray(&p->vPages);
    }
    pObj = Mig_ManObj( p, p->nObjs++ );
    assert( Mig_ObjIsNone(pObj) );
    Mig_ObjSetId( pObj, p->nObjs-1 );
    return pObj;
}